

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsVisitor::~ZConsVisitor(ZConsVisitor *this)

{
  ZConsReader *this_00;
  
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__ZConsVisitor_00288678;
  this_00 = this->zconsReader_;
  if (this_00 != (ZConsReader *)0x0) {
    ZConsReader::~ZConsReader(this_00);
  }
  operator_delete(this_00,0x248);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->zatomToZmol_)._M_t);
  std::__cxx11::string::~string((string *)&this->zconsFilename_);
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>,_std::_Select1st<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
  ::~_Rb_tree(&(this->zmolStates_)._M_t);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->zconsPos).super__Vector_base<double,_std::allocator<double>_>);
  BaseVisitor::~BaseVisitor(&this->super_BaseVisitor);
  return;
}

Assistant:

ZConsVisitor::~ZConsVisitor() { delete zconsReader_; }